

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_test.cc
# Opt level: O0

void __thiscall
test_libaom::AV1CornerMatch::AV1CornerMatchTest::RunSpeedTest(AV1CornerMatchTest *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
  *p_Var2;
  int64_t iVar3;
  pointer puVar4;
  pointer puVar5;
  long in_RDI;
  int i_3;
  int i_2;
  int elapsed_time_simd;
  int i_1;
  double simd_one_over_stddev2;
  double simd_mean2;
  double simd_one_over_stddev1;
  double simd_mean1;
  int elapsed_time_c;
  int i;
  double c_one_over_stddev2;
  double c_mean2;
  double c_one_over_stddev1;
  double c_mean1;
  int mode;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> input1;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  int num_iters;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_fffffffffffffe08;
  double *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  uint8_t *in_stack_fffffffffffffe20;
  double dVar6;
  uint8_t *in_stack_fffffffffffffe28;
  double dVar7;
  AV1CornerMatchTest *in_stack_fffffffffffffe30;
  code *pcVar8;
  Message *in_stack_fffffffffffffe78;
  AssertHelper *in_stack_fffffffffffffe80;
  int local_130;
  int local_12c;
  int local_124;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  int local_100;
  int local_fc;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  __tuple_element_t<0UL,_tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
  local_d4;
  undefined8 local_c0;
  AssertionResult local_b8;
  uint local_a4;
  undefined8 local_80;
  AssertionResult local_78 [2];
  aom_usec_timer local_58;
  aom_usec_timer local_38;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x10;
  local_10 = 0x10;
  local_14 = 1000000;
  operator_new__(0x100,(nothrow_t *)&std::nothrow);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (uchar *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  operator_new__(0x100,(nothrow_t *)&std::nothrow);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (uchar *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_80 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (void **)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe30);
    testing::AssertionResult::failure_message((AssertionResult *)0x31570d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe30,
               (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),(char *)in_stack_fffffffffffffe20,
               (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    testing::Message::~Message((Message *)0x315770);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3157de);
  if (local_a4 == 0) {
    local_c0 = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              (in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
               ,(void **)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe30);
      testing::AssertionResult::failure_message((AssertionResult *)0x315897);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe30,
                 (Type)((ulong)in_stack_fffffffffffffe28 >> 0x20),(char *)in_stack_fffffffffffffe20,
                 (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(char *)in_stack_fffffffffffffe10);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      testing::Message::~Message((Message *)0x3158fa);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x315968);
    if (local_a4 == 0) {
      testing::
      WithParamInterface<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
      ::GetParam();
      p_Var2 = std::
               get<0ul,int,bool(*)(unsigned_char_const*,int,int,int,double*,double*),double(*)(unsigned_char_const*,int,int,int,double,double,unsigned_char_const*,int,int,int,double,double)>
                         ((tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>
                           *)0x315995);
      local_d4 = *p_Var2;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      GenerateInput(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                    (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
                    (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      ::aom_usec_timer_start((aom_usec_timer *)0x315a11);
      for (local_fc = 0; local_fc < 1000000; local_fc = local_fc + 1) {
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        aom_compute_mean_stddev_c
                  (in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (int)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   in_stack_fffffffffffffe10,(double *)in_stack_fffffffffffffe08);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        aom_compute_mean_stddev_c
                  (in_stack_fffffffffffffe28,(int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (int)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   in_stack_fffffffffffffe10,(double *)in_stack_fffffffffffffe08);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0x315ac6);
      iVar3 = ::aom_usec_timer_elapsed(&local_38);
      local_100 = (int)iVar3;
      ::aom_usec_timer_start((aom_usec_timer *)0x315af5);
      for (local_124 = 0; local_124 < 1000000; local_124 = local_124 + 1) {
        pcVar8 = *(code **)(in_RDI + 0x18);
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        (*pcVar8)(puVar4,0x10,0,0,local_108,local_110);
        pcVar8 = *(code **)(in_RDI + 0x18);
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        (*pcVar8)(puVar4,0x10,0,0,local_118,local_120);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0x315bbe);
      iVar3 = ::aom_usec_timer_elapsed(&local_58);
      printf("aom_compute_mean_stddev(): c_time=%6d   simd_time=%6d   gain=%.3f\n",
             (double)local_100 / (double)(int)iVar3);
      ::aom_usec_timer_start((aom_usec_timer *)0x315c17);
      for (local_12c = 0; local_12c < 1000000; local_12c = local_12c + 1) {
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        dVar7 = local_e0;
        dVar6 = local_e8;
        puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        in_stack_fffffffffffffe00 = 0;
        aom_compute_correlation_c(puVar4,0x10,0,0,dVar7,dVar6,puVar5,0x10,0,0,local_f0,local_f8);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0x315ce1);
      iVar3 = ::aom_usec_timer_elapsed(&local_38);
      local_100 = (int)iVar3;
      ::aom_usec_timer_start((aom_usec_timer *)0x315d10);
      for (local_130 = 0; local_130 < 1000000; local_130 = local_130 + 1) {
        pcVar8 = *(code **)(in_RDI + 0x20);
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        dVar6 = local_e0;
        dVar7 = local_e8;
        puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        in_stack_fffffffffffffe00 = 0;
        (*pcVar8)(dVar6,dVar7,local_f0,local_f8,puVar4,0x10,0,0,puVar5,0x10,0);
      }
      ::aom_usec_timer_mark((aom_usec_timer *)0x315ded);
      iVar3 = ::aom_usec_timer_elapsed(&local_58);
      printf("aom_compute_correlation(): c_time=%6d   simd_time=%6d   gain=%.3f\n",
             (double)local_100 / (double)(int)iVar3);
      local_a4 = 0;
    }
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  return;
}

Assistant:

void AV1CornerMatchTest::RunSpeedTest() {
  const int w = 16, h = 16;
  const int num_iters = 1000000;
  aom_usec_timer ref_timer, test_timer;

  std::unique_ptr<uint8_t[]> input1(new (std::nothrow) uint8_t[w * h]);
  std::unique_ptr<uint8_t[]> input2(new (std::nothrow) uint8_t[w * h]);
  ASSERT_NE(input1, nullptr);
  ASSERT_NE(input2, nullptr);

  // Test the two extreme cases:
  // i) Random data, should have correlation close to 0
  // ii) Linearly related data + noise, should have correlation close to 1
  int mode = GET_PARAM(0);
  GenerateInput(&input1[0], &input2[0], w, h, mode);

  // Time aom_compute_mean_stddev()
  double c_mean1, c_one_over_stddev1, c_mean2, c_one_over_stddev2;
  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_iters; i++) {
    aom_compute_mean_stddev_c(input1.get(), w, 0, 0, &c_mean1,
                              &c_one_over_stddev1);
    aom_compute_mean_stddev_c(input2.get(), w, 0, 0, &c_mean2,
                              &c_one_over_stddev2);
  }
  aom_usec_timer_mark(&ref_timer);
  int elapsed_time_c = static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  double simd_mean1, simd_one_over_stddev1, simd_mean2, simd_one_over_stddev2;
  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_iters; i++) {
    target_compute_mean_stddev_func(input1.get(), w, 0, 0, &simd_mean1,
                                    &simd_one_over_stddev1);
    target_compute_mean_stddev_func(input2.get(), w, 0, 0, &simd_mean2,
                                    &simd_one_over_stddev2);
  }
  aom_usec_timer_mark(&test_timer);
  int elapsed_time_simd = static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf(
      "aom_compute_mean_stddev(): c_time=%6d   simd_time=%6d   "
      "gain=%.3f\n",
      elapsed_time_c, elapsed_time_simd,
      (elapsed_time_c / (double)elapsed_time_simd));

  // Time aom_compute_correlation
  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_iters; i++) {
    aom_compute_correlation_c(input1.get(), w, 0, 0, c_mean1,
                              c_one_over_stddev1, input2.get(), w, 0, 0,
                              c_mean2, c_one_over_stddev2);
  }
  aom_usec_timer_mark(&ref_timer);
  elapsed_time_c = static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_iters; i++) {
    target_compute_corr_func(input1.get(), w, 0, 0, c_mean1, c_one_over_stddev1,
                             input2.get(), w, 0, 0, c_mean2,
                             c_one_over_stddev2);
  }
  aom_usec_timer_mark(&test_timer);
  elapsed_time_simd = static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf(
      "aom_compute_correlation(): c_time=%6d   simd_time=%6d   "
      "gain=%.3f\n",
      elapsed_time_c, elapsed_time_simd,
      (elapsed_time_c / (double)elapsed_time_simd));
}